

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

void __thiscall cs222::Symbol::Symbol(Symbol *this,string *name,int *value,Type *type)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->value = *value;
  this->type = *type;
  return;
}

Assistant:

Symbol::Symbol(
            const string& name,
            const int& value,
            const Type& type) :
        name(name), value(value), type(type) { }